

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkDfs.c
# Opt level: O2

Vec_Ptr_t * Nwk_ManSupportNodes(Nwk_Man_t *pNtk,Nwk_Obj_t **ppNodes,int nNodes)

{
  Vec_Ptr_t *vNodes;
  ulong uVar1;
  Nwk_Obj_t *pNode;
  ulong uVar2;
  
  Nwk_ManIncrementTravId(pNtk);
  vNodes = Vec_PtrAlloc(100);
  uVar2 = 0;
  uVar1 = (ulong)(uint)nNodes;
  if (nNodes < 1) {
    uVar1 = uVar2;
  }
  for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    pNode = ppNodes[uVar2];
    if ((*(uint *)&pNode->field_0x20 & 7) == 2) {
      pNode = *pNode->pFanio;
    }
    Nwk_ManSupportNodes_rec(pNode,vNodes);
  }
  return vNodes;
}

Assistant:

Vec_Ptr_t * Nwk_ManSupportNodes( Nwk_Man_t * pNtk, Nwk_Obj_t ** ppNodes, int nNodes )
{
    Vec_Ptr_t * vNodes;
    int i;
    // set the traversal ID
    Nwk_ManIncrementTravId( pNtk );
    // start the array of nodes
    vNodes = Vec_PtrAlloc( 100 );
    // go through the PO nodes and call for each of them
    for ( i = 0; i < nNodes; i++ )
        if ( Nwk_ObjIsCo(ppNodes[i]) )
            Nwk_ManSupportNodes_rec( Nwk_ObjFanin0(ppNodes[i]), vNodes );
        else
            Nwk_ManSupportNodes_rec( ppNodes[i], vNodes );
    return vNodes;
}